

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O2

void digactualhole(int x,int y,monst *madeby,int ttyp)

{
  undefined1 *puVar1;
  monst *pmVar2;
  uint3 uVar3;
  level *plVar4;
  boolean bVar5;
  xchar xVar6;
  schar sVar7;
  int iVar8;
  trap *ptVar9;
  permonst *ppVar10;
  char *pcVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  schar *psVar16;
  long lVar17;
  monst *mtmp;
  xchar x_00;
  long lVar18;
  bool bVar19;
  char cVar20;
  int by;
  long local_158;
  uint local_14c;
  long local_148;
  long local_140;
  char surface_type [256];
  
  plVar4 = level;
  local_158 = CONCAT44(local_158._4_4_,ttyp);
  lVar18 = (long)x;
  lVar17 = (long)y;
  local_140 = lVar18 * 0xa8;
  pmVar2 = level->monsters[lVar18][lVar17];
  if (pmVar2 == (monst *)0x0) {
    mtmp = (monst *)0x0;
  }
  else {
    mtmp = (monst *)0x0;
    if ((pmVar2->field_0x61 & 2) == 0) {
      mtmp = pmVar2;
    }
  }
  uVar13 = u.uy ^ y | u.ux ^ x;
  uVar3 = (uint3)(uVar13 >> 8);
  uVar14 = (uint)CONCAT71((uint7)uVar3,1);
  if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
       ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 1) == 0)) {
    if (u.usteed == (monst *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = CONCAT31(uVar3,(char)(u.usteed)->data->mflags1) & 0xffffff01;
    }
  }
  if ((u.utrap != 0) && (u.utraptype == 4)) {
    u.utrap = 0;
  }
  cVar20 = level->locations[lVar18][lVar17].typ;
  if (cVar20 == '$') {
LAB_00162bfc:
    by = y;
    surface_type._0_4_ = x;
    find_drawbridge((int *)surface_type,&by);
    destroy_drawbridge(surface_type._0_4_,by);
    return;
  }
  if (cVar20 == '\x1f') {
    breaksink(x,y);
    return;
  }
  xVar6 = (xchar)y;
  x_00 = (xchar)x;
  if (cVar20 == '\x1c') {
    dogushforth(0);
    puVar1 = &level->locations[lVar18][lVar17].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x20;
    dryup(x_00,xVar6,madeby == &youmonst);
    return;
  }
  local_14c = uVar14;
  local_148 = lVar17;
  iVar8 = is_drawbridge_wall(x,y);
  if (-1 < iVar8) goto LAB_00162bfc;
  psVar16 = &plVar4->locations[lVar18][lVar17].typ;
  lVar17 = local_140;
  iVar8 = 0xb;
  if ((int)local_158 != 0xb) {
    bVar5 = can_dig_down(level);
    lVar17 = local_140;
    iVar8 = (int)local_158;
    if (bVar5 == '\0') {
      impossible("digactualhole: can\'t dig %s on this level.",
                 defexplain[(long)(int)local_158 + 0x2f]);
      iVar8 = 0xb;
    }
  }
  local_158 = lVar18;
  if (*psVar16 == ' ') {
    builtin_strncpy(surface_type,"grave",6);
    bVar19 = false;
  }
  else {
    pcVar11 = surface(x,y);
    strcpy(surface_type,pcVar11);
    if (*psVar16 == '\x17') {
      pcVar11 = in_rooms(level,x_00,xVar6,0x12);
      bVar19 = *pcVar11 != '\0';
      lVar17 = local_140;
    }
    else {
      bVar19 = false;
      lVar17 = local_140;
    }
  }
  lVar18 = *(long *)((long)level->objects[0] + local_148 * 8 + lVar17);
  ptVar9 = maketrap(level,x,y,iVar8);
  if (ptVar9 == (trap *)0x0) {
    return;
  }
  if (madeby == &youmonst) {
    bVar12 = 0xa0;
  }
  else {
    bVar12 = (viz_array[local_148][local_158] & 2U) << 4;
  }
  lVar17 = *(long *)((long)level->objects[0] + local_148 * 8 + lVar17);
  ptVar9->field_0x8 = ptVar9->field_0x8 & 0x5f | bVar12;
  newsym((int)ptVar9->tx,(int)ptVar9->ty);
  if (iVar8 != 0xb) {
    if (madeby == &youmonst) {
      pline("You dig a hole through the %s.",surface_type);
    }
    else {
      if (madeby != (monst *)0x0) {
        if (madeby->wormno == '\0') {
          if ((viz_array[madeby->my][madeby->mx] & 2U) != 0) goto LAB_00163205;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00162f67;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162f5e;
          }
          else {
LAB_00162f5e:
            if (ublindf == (obj *)0x0) goto LAB_0016326a;
LAB_00162f67:
            if (ublindf->oartifact != '\x1d') goto LAB_0016326a;
          }
          if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
              (((youmonst.data)->mflags3 & 0x100) == 0)) ||
             (((viz_array[madeby->my][madeby->mx] & 1U) == 0 ||
              ((madeby->data->mflags3 & 0x200) == 0)))) goto LAB_0016326a;
        }
        else {
          bVar5 = worm_known(level,madeby);
          if (bVar5 == '\0') goto LAB_0016326a;
        }
LAB_00163205:
        uVar14 = *(uint *)&madeby->field_0x60;
        if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar14 & 0x280) == 0) goto LAB_00163241;
        }
        else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00163241:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar11 = Monnam(madeby);
            pline("%s digs a hole through the %s.",pcVar11,surface_type);
            goto LAB_001632c1;
          }
        }
      }
LAB_0016326a:
      if (((viz_array[local_148][local_158] & 2U) != 0) && (flags.verbose != '\0')) {
        pline("A hole appears in the %s.",surface_type);
      }
    }
LAB_001632c1:
    if (uVar13 == 0) {
      cVar20 = (char)local_14c;
      if ((u.ustuck == (monst *)0x0) && (cVar20 == '\0')) {
        bVar5 = next_to_u();
        cVar20 = bVar5 == '\0';
        if ((bool)cVar20) {
          pline("You are jerked back by your pet!");
        }
      }
      if ((u.ustuck == (monst *)0x0) && (cVar20 == '\0')) {
        if ((madeby == &youmonst) && (u.ushops[0] != '\0')) {
          shopdig(1);
        }
        else if (madeby != &youmonst) {
          pay_for_damage("dig into",'\x01');
        }
        pline("You fall through...");
        by._0_2_ = CONCAT11(u.uz.dlevel + '\x01',u.uz.dnum);
        goto_level((d_level *)&by,'\0','\x01','\0');
        spoteffects('\0');
        return;
      }
      if (lVar17 != 0) {
        impact_drop((obj *)0x0,x_00,xVar6,'\0');
      }
      if (lVar18 != lVar17) {
        pickup(1);
      }
      if (!bVar19 || madeby != &youmonst) {
        return;
      }
      pay_for_damage("ruin",'\0');
      return;
    }
    if (bVar19 && madeby == &youmonst) {
      pay_for_damage("ruin",'\0');
    }
    if (lVar17 != 0) {
      impact_drop((obj *)0x0,x_00,xVar6,'\0');
    }
    if (mtmp == (monst *)0x0) {
      return;
    }
    ppVar10 = mtmp->data;
    if ((ppVar10->mflags1 & 1) != 0) {
      return;
    }
    if (ppVar10 == mons + 0x56 || ppVar10->mlet == '\x05') {
      return;
    }
    if (mtmp->wormno != '\0') {
      iVar8 = count_wsegs(mtmp);
      if (5 < iVar8) {
        return;
      }
      ppVar10 = mtmp->data;
    }
    if (3 < ppVar10->msize) {
      return;
    }
    if (mtmp == u.ustuck) {
      return;
    }
    bVar5 = teleport_pet(mtmp,'\0');
    if (bVar5 == '\0') {
      return;
    }
    bVar5 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar5 != '\0') {
      assign_level((d_level *)&by,&dungeon_topology.d_valley_level);
LAB_001633fb:
      if ((mtmp->field_0x63 & 2) != 0) {
        make_angry_shk(mtmp,'\0','\0');
      }
      xVar6 = ledger_no((d_level *)&by);
      migrate_to_level(mtmp,xVar6,'\0',(coord *)0x0);
      return;
    }
    bVar5 = Is_botlevel(&u.uz);
    if (bVar5 == '\0') {
      sVar7 = depth(&u.uz);
      get_level((d_level *)&by,sVar7 + 1);
      goto LAB_001633fb;
    }
    if (mtmp->wormno != '\0') {
      bVar5 = worm_known(level,mtmp);
      if (bVar5 == '\0') {
        return;
      }
      goto LAB_0016373f;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_0016373f;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001636cb;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001636c2;
    }
    else {
LAB_001636c2:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_001636cb:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return;
    }
    if ((mtmp->data->mflags3 & 0x200) == 0) {
      return;
    }
LAB_0016373f:
    uVar13 = *(uint *)&mtmp->field_0x60;
    if ((((uVar13 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar13 & 0x280) != 0) {
        return;
      }
    }
    else {
      if ((uVar13 & 0x280) != 0) {
        return;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return;
    }
    pcVar11 = Monnam(mtmp);
    pline("%s avoids the trap.",pcVar11);
    return;
  }
  if (madeby == &youmonst) {
    pline("You dig a pit in the %s.",surface_type);
    if (bVar19) {
      pay_for_damage("ruin",'\0');
    }
  }
  else {
    if (madeby != (monst *)0x0) {
      if (madeby->wormno == '\0') {
        if ((viz_array[madeby->my][madeby->mx] & 2U) != 0) goto LAB_00162fd1;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00162f15;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00162f0c;
        }
        else {
LAB_00162f0c:
          if (ublindf == (obj *)0x0) goto LAB_00163037;
LAB_00162f15:
          if (ublindf->oartifact != '\x1d') goto LAB_00163037;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[madeby->my][madeby->mx] & 1U) == 0)) ||
           ((madeby->data->mflags3 & 0x200) == 0)) goto LAB_00163037;
      }
      else {
        bVar5 = worm_known(level,madeby);
        if (bVar5 == '\0') goto LAB_00163037;
      }
LAB_00162fd1:
      uVar14 = *(uint *)&madeby->field_0x60;
      if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar14 & 0x280) == 0) goto LAB_0016300e;
      }
      else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0016300e:
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar11 = Monnam(madeby);
          pline("%s digs a pit in the %s.",pcVar11,surface_type);
          goto LAB_00163086;
        }
      }
    }
LAB_00163037:
    if (((viz_array[local_148][local_158] & 2U) != 0) && (flags.verbose != '\0')) {
      pline("A pit appears in the %s.",surface_type);
    }
  }
LAB_00163086:
  if (uVar13 == 0) {
    if ((char)local_14c == '\0') {
      if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 8) == 0)) {
        uVar13 = mt_random();
        u.utrap = (uVar13 & 3) + 2;
      }
      u.utraptype = 1;
      vision_full_recalc = '\x01';
    }
    else {
      u.utrap = 0;
    }
    if (lVar18 == lVar17) {
      return;
    }
    pickup(1);
    return;
  }
  if (mtmp == (monst *)0x0) {
    return;
  }
  ppVar10 = mtmp->data;
  if (((ppVar10->mflags1 & 1) == 0) && (ppVar10->mlet != '\x05')) {
    if (mtmp == madeby) {
      return;
    }
    mintrap(mtmp);
    return;
  }
  if (mtmp->wormno != '\0') {
    bVar5 = worm_known(level,mtmp);
    if (bVar5 == '\0') {
      return;
    }
    goto LAB_00163598;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00163598;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016317f;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00163176;
  }
  else {
LAB_00163176:
    if (ublindf == (obj *)0x0) {
      return;
    }
LAB_0016317f:
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
     (((youmonst.data)->mflags3 & 0x100) == 0)) {
    return;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
    return;
  }
  if ((ppVar10->mflags3 & 0x200) == 0) {
    return;
  }
LAB_00163598:
  uVar13 = *(uint *)&mtmp->field_0x60;
  if ((((uVar13 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar13 & 0x280) != 0) {
      return;
    }
  }
  else {
    if ((uVar13 & 0x280) != 0) {
      return;
    }
    if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
      return;
    }
  }
  if ((u._1052_1_ & 0x20) != 0) {
    return;
  }
  pcVar11 = Monnam(mtmp);
  pcVar15 = "flies";
  if ((mtmp->data->mflags1 & 1) == 0) {
    pcVar15 = "floats";
  }
  pline("%s %s over the pit.",pcVar11,pcVar15);
  return;
}

Assistant:

void digactualhole(int x, int y, struct monst *madeby, int ttyp)
{
	struct obj *oldobjs, *newobjs;
	struct trap *ttmp;
	char surface_type[BUFSZ];
	struct rm *loc = &level->locations[x][y];
	boolean shopdoor;
	struct monst *mtmp = m_at(level, x, y);	/* may be madeby */
	boolean madeby_u = (madeby == BY_YOU);
	boolean madeby_obj = (madeby == BY_OBJECT);
	boolean at_u = (x == u.ux) && (y == u.uy);
	boolean wont_fall = Levitation || Flying;

	if (u.utrap && u.utraptype == TT_INFLOOR) u.utrap = 0;

	/* these furniture checks were in dighole(), but wand
	   breaking bypasses that routine and calls us directly */
	if (IS_FOUNTAIN(loc->typ)) {
	    dogushforth(FALSE);
	    SET_FOUNTAIN_WARNED(x,y);		/* force dryup */
	    dryup(x, y, madeby_u);
	    return;
	} else if (IS_SINK(loc->typ)) {
	    breaksink(x, y);
	    return;
	} else if (loc->typ == DRAWBRIDGE_DOWN ||
		   (is_drawbridge_wall(x, y) >= 0)) {
	    int bx = x, by = y;
	    /* if under the portcullis, the bridge is adjacent */
	    find_drawbridge(&bx, &by);
	    destroy_drawbridge(bx, by);
	    return;
	}

	if (ttyp != PIT && !can_dig_down(level)) {
	    impossible("digactualhole: can't dig %s on this level.",
		       trapexplain[ttyp-1]);
	    ttyp = PIT;
	}

	/* maketrap(level, ) might change it, also, in this situation,
	   surface() returns an inappropriate string for a grave */
	if (IS_GRAVE(loc->typ))
	    strcpy(surface_type, "grave");
	else
	    strcpy(surface_type, surface(x,y));
	shopdoor = IS_DOOR(loc->typ) && *in_rooms(level, x, y, SHOPBASE);
	oldobjs = level->objects[x][y];
	ttmp = maketrap(level, x, y, ttyp);
	if (!ttmp) return;
	newobjs = level->objects[x][y];
	ttmp->tseen = (madeby_u || cansee(x,y));
	ttmp->madeby_u = madeby_u;
	newsym(ttmp->tx,ttmp->ty);

	if (ttyp == PIT) {

	    if (madeby_u) {
		pline("You dig a pit in the %s.", surface_type);
		if (shopdoor) pay_for_damage("ruin", FALSE);
	    } else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a pit in the %s.", Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A pit appears in the %s.", surface_type);

	    if (at_u) {
		if (!wont_fall) {
		    if (!Passes_walls)
			u.utrap = rn1(4,2);
		    u.utraptype = TT_PIT;
		    vision_full_recalc = 1;	/* vision limits change */
		} else
		    u.utrap = 0;
		if (oldobjs != newobjs)	/* something unearthed */
			pickup(1);	/* detects pit */
	    } else if (mtmp) {
		if (is_flyer(mtmp->data) || is_floater(mtmp->data)) {
		    if (canseemon(level, mtmp))
			pline("%s %s over the pit.", Monnam(mtmp),
						     (is_flyer(mtmp->data)) ?
						     "flies" : "floats");
		} else if (mtmp != madeby)
		    mintrap(mtmp);
	    }
	} else {	/* was TRAPDOOR now a HOLE*/

	    if (madeby_u)
		pline("You dig a hole through the %s.", surface_type);
	    else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a hole through the %s.",
		      Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A hole appears in the %s.", surface_type);

	    if (at_u) {
		if (!u.ustuck && !wont_fall && !next_to_u()) {
		    pline("You are jerked back by your pet!");
		    wont_fall = TRUE;
		}

		/* Floor objects get a chance of falling down.  The case where
		 * the hero does NOT fall down is treated here.  The case
		 * where the hero does fall down is treated in goto_level().
		 */
		if (u.ustuck || wont_fall) {
		    if (newobjs)
			impact_drop(NULL, x, y, 0);
		    if (oldobjs != newobjs)
			pickup(1);
		    if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);

		} else {
		    d_level newlevel;

		    if (*u.ushops && madeby_u)
			shopdig(1); /* shk might snatch pack */
		    /* handle earlier damage, eg breaking wand of digging */
		    else if (!madeby_u) pay_for_damage("dig into", TRUE);

		    pline("You fall through...");
		    /* Earlier checks must ensure that the destination
		     * level exists and is in the present dungeon.
		     */
		    newlevel.dnum = u.uz.dnum;
		    newlevel.dlevel = u.uz.dlevel + 1;
		    goto_level(&newlevel, FALSE, TRUE, FALSE);
		    /* messages for arriving in special rooms */
		    spoteffects(FALSE);
		}
	    } else {
		if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);
		if (newobjs)
		    impact_drop(NULL, x, y, 0);
		if (mtmp) {
		     /*[don't we need special sokoban handling here?]*/
		    if (is_flyer(mtmp->data) || is_floater(mtmp->data) ||
		        mtmp->data == &mons[PM_WUMPUS] ||
			(mtmp->wormno && count_wsegs(mtmp) > 5) ||
			mtmp->data->msize >= MZ_HUGE) return;
		    if (mtmp == u.ustuck)	/* probably a vortex */
			    return;		/* temporary? kludge */

		    if (teleport_pet(mtmp, FALSE)) {
			d_level tolevel;

			if (Is_stronghold(&u.uz)) {
			    assign_level(&tolevel, &valley_level);
			} else if (Is_botlevel(&u.uz)) {
			    if (canseemon(level, mtmp))
				pline("%s avoids the trap.", Monnam(mtmp));
			    return;
			} else {
			    get_level(&tolevel, depth(&u.uz) + 1);
			}
			if (mtmp->isshk) make_angry_shk(mtmp, 0, 0);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
		    }
		}
	    }
	}
}